

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  long *plVar4;
  ulong *puVar5;
  undefined1 local_88 [8];
  FilePath dir;
  __string_type __str;
  ulong local_38;
  long lStack_30;
  
  if ((directory->pathname_)._M_string_length == 0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar2 = (relative_path->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (relative_path->pathname_)._M_string_length);
  }
  else {
    RemoveTrailingPathSeparator((FilePath *)local_88,directory);
    dir.pathname_.field_2._8_8_ = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&dir.pathname_.field_2 + 8),local_88,
               dir.pathname_._M_dataplus._M_p + (long)local_88);
    std::__cxx11::string::_M_replace_aux
              ((ulong)((long)&dir.pathname_.field_2 + 8),(ulong)__str._M_dataplus._M_p,0,'\x01');
    plVar4 = (long *)std::__cxx11::string::_M_append
                               (dir.pathname_.field_2._M_local_buf + 8,
                                (ulong)(relative_path->pathname_)._M_dataplus._M_p);
    puVar5 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar5) {
      local_38 = *puVar5;
      lStack_30 = plVar4[3];
      __str.field_2._8_8_ = &local_38;
    }
    else {
      local_38 = *puVar5;
      __str.field_2._8_8_ = (ulong *)*plVar4;
    }
    sVar3 = plVar4[1];
    *plVar4 = (long)puVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    paVar1 = &(__return_storage_ptr__->pathname_).field_2;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)paVar1;
    if ((ulong *)__str.field_2._8_8_ == &local_38) {
      paVar1->_M_allocated_capacity = local_38;
      *(long *)((long)&(__return_storage_ptr__->pathname_).field_2 + 8) = lStack_30;
    }
    else {
      (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)__str.field_2._8_8_;
      (__return_storage_ptr__->pathname_).field_2._M_allocated_capacity = local_38;
    }
    (__return_storage_ptr__->pathname_)._M_string_length = sVar3;
    local_38 = local_38 & 0xffffffffffffff00;
    __str.field_2._8_8_ = &local_38;
    Normalize(__return_storage_ptr__);
    if ((ulong *)__str.field_2._8_8_ != &local_38) {
      operator_delete((void *)__str.field_2._8_8_,local_38 + 1);
    }
    if ((size_type *)dir.pathname_.field_2._8_8_ != &__str._M_string_length) {
      operator_delete((void *)dir.pathname_.field_2._8_8_,__str._M_string_length + 1);
    }
    if (local_88 != (undefined1  [8])&dir.pathname_._M_string_length) {
      operator_delete((void *)local_88,dir.pathname_._M_string_length + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty()) return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}